

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  byte *pbVar2;
  ulong uVar3;
  void *pvVar4;
  ZSTD_CDict *cdict;
  bool bVar5;
  int iVar6;
  ZSTD_EndDirective ZVar7;
  size_t pos;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  void *pvVar14;
  ZSTD_CCtx_params *pZVar15;
  undefined8 *puVar16;
  size_t srcSize;
  ulong uVar17;
  BYTE *istart;
  ulong uVar18;
  uint blockToFlush;
  ZSTD_CCtx_params in_stack_ffffffffffffff28;
  
  uVar3 = output->pos;
  sVar13 = output->size - uVar3;
  if (output->size < uVar3) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5234,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  uVar18 = input->size;
  uVar8 = input->pos;
  srcSize = uVar18 - uVar8;
  if (uVar18 < uVar8) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5235,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (mtctx->singleBlockingThread != 0) {
    sVar13 = ZSTD_compressStream2(mtctx->cctxPool->cctx[0],output,input,endOp);
    return sVar13;
  }
  if ((endOp != ZSTD_e_continue) || (sVar11 = 0xffffffffffffffc4, mtctx->frameEnded == 0)) {
    if ((((mtctx->params).rsyncable == 0) &&
        (((mtctx->nextJobID == 0 && ((mtctx->inBuff).filled == 0)) && (endOp == ZSTD_e_end)))) &&
       (mtctx->jobReady == 0)) {
      uVar9 = 0;
      if (srcSize < 0x20000) {
        uVar9 = -(srcSize - 0x20000) >> 0xb;
      }
      if ((srcSize >> 8) + srcSize + uVar9 <= sVar13) {
        pvVar4 = output->dst;
        pvVar14 = input->src;
        cdict = mtctx->cdict;
        pZVar15 = &mtctx->params;
        puVar16 = (undefined8 *)&stack0xffffffffffffff28;
        for (lVar12 = 0x12; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar16 = *(undefined8 *)pZVar15;
          pZVar15 = (ZSTD_CCtx_params *)&(pZVar15->cParams).chainLog;
          puVar16 = puVar16 + 1;
        }
        sVar13 = ZSTDMT_compress_advanced_internal
                           (mtctx,(void *)(uVar3 + (long)pvVar4),sVar13,
                            (void *)(uVar8 + (long)pvVar14),srcSize,cdict,in_stack_ffffffffffffff28)
        ;
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
        input->pos = input->size;
        output->pos = output->pos + sVar13;
        mtctx->frameEnded = 1;
        mtctx->allJobsCompleted = 1;
        return 0;
      }
    }
    blockToFlush = 1;
    if ((uVar8 < uVar18) && (mtctx->jobReady == 0)) {
      if ((mtctx->inBuff).buffer.start == (void *)0x0) {
        if ((mtctx->inBuff).filled != 0) {
          __assert_fail("mtctx->inBuff.filled == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5257,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        iVar6 = ZSTDMT_tryGetInputRange(mtctx);
        if ((iVar6 == 0) && (mtctx->doneJobID == mtctx->nextJobID)) {
          __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x525d,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
      }
      pvVar4 = (mtctx->inBuff).buffer.start;
      if (pvVar4 == (void *)0x0) {
        blockToFlush = 1;
      }
      else {
        pvVar14 = (void *)((long)input->src + input->pos);
        uVar8 = input->size - input->pos;
        uVar3 = (mtctx->inBuff).filled;
        uVar18 = mtctx->targetSectionSize - uVar3;
        if (uVar8 < uVar18) {
          uVar18 = uVar8;
        }
        bVar5 = false;
        if (((mtctx->params).rsyncable != 0) && (0x1f < uVar18 + uVar3)) {
          if (uVar3 < 0x20) {
            if (uVar3 == 0) {
              uVar8 = 0;
            }
            else {
              uVar9 = 0;
              uVar8 = 0;
              do {
                uVar8 = uVar8 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar4 + uVar9) + 10;
                uVar9 = uVar9 + 1;
              } while (uVar3 != uVar9);
            }
            uVar17 = 0x20 - uVar3;
            uVar9 = 0;
            do {
              uVar8 = uVar8 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar14 + uVar9) + 10;
              uVar9 = uVar9 + 1;
            } while (uVar17 != uVar9);
          }
          else {
            lVar12 = -0x20;
            uVar17 = 0;
            uVar8 = 0;
            do {
              uVar8 = uVar8 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar4 + lVar12 + uVar3)
                      + 10;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0);
          }
          uVar9 = (mtctx->rsync).hitMask;
          bVar5 = false;
          do {
            if (uVar18 <= uVar17) goto LAB_0015006c;
            pbVar2 = (byte *)((long)pvVar14 + (uVar17 - 0x20));
            pbVar10 = (byte *)((long)pvVar4 + uVar17 + (uVar3 - 0x20));
            if (0x1f < uVar17) {
              pbVar10 = pbVar2;
            }
            uVar8 = (uVar8 - ((ulong)*pbVar10 + 10) * (mtctx->rsync).primePower) *
                    -0x30e44323485a9b9d + (ulong)pbVar2[0x20] + 10;
            uVar17 = uVar17 + 1;
          } while ((uVar8 & uVar9) != uVar9);
          bVar5 = true;
          uVar18 = uVar17;
        }
LAB_0015006c:
        if ((mtctx->inBuff).buffer.capacity < mtctx->targetSectionSize) {
          __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5266,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        ZVar7 = ZSTD_e_flush;
        if (!bVar5) {
          ZVar7 = endOp;
        }
        if (endOp == ZSTD_e_continue) {
          endOp = ZVar7;
        }
        memcpy((void *)((long)pvVar4 + uVar3),pvVar14,uVar18);
        input->pos = input->pos + uVar18;
        psVar1 = &(mtctx->inBuff).filled;
        *psVar1 = *psVar1 + uVar18;
        blockToFlush = (uint)(uVar18 == 0);
      }
      ZVar7 = ZSTD_e_flush;
      if (endOp != ZSTD_e_end) {
        ZVar7 = endOp;
      }
      if (input->pos < input->size) {
        endOp = ZVar7;
      }
    }
    if ((((mtctx->jobReady != 0) ||
         (uVar3 = (mtctx->inBuff).filled, mtctx->targetSectionSize <= uVar3)) ||
        (endOp != ZSTD_e_continue && uVar3 != 0)) ||
       ((endOp == ZSTD_e_end && (mtctx->frameEnded == 0)))) {
      sVar13 = (mtctx->inBuff).filled;
      if (mtctx->targetSectionSize < sVar13) {
        __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5277,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      ZSTDMT_createCompressionJob(mtctx,sVar13,endOp);
    }
    sVar13 = ZSTDMT_flushProduced(mtctx,output,blockToFlush,endOp);
    sVar11 = sVar13 + (sVar13 == 0);
    if (input->size <= input->pos) {
      sVar11 = sVar13;
    }
  }
  return sVar11;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if (mtctx->singleBlockingThread) {  /* delegate to single-thread (synchronous) */
        return ZSTD_compressStream2(mtctx->cctxPool->cctx[0], output, input, endOp);
    }

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* single-pass shortcut (note : synchronous-mode) */
    if ( (!mtctx->params.rsyncable)   /* rsyncable mode is disabled */
      && (mtctx->nextJobID == 0)      /* just started */
      && (mtctx->inBuff.filled == 0)  /* nothing buffered */
      && (!mtctx->jobReady)           /* no job already created */
      && (endOp == ZSTD_e_end)        /* end order */
      && (output->size - output->pos >= ZSTD_compressBound(input->size - input->pos)) ) { /* enough space in dst */
        size_t const cSize = ZSTDMT_compress_advanced_internal(mtctx,
                (char*)output->dst + output->pos, output->size - output->pos,
                (const char*)input->src + input->pos, input->size - input->pos,
                mtctx->cdict, mtctx->params);
        if (ZSTD_isError(cSize)) return cSize;
        input->pos = input->size;
        output->pos += cSize;
        mtctx->allJobsCompleted = 1;
        mtctx->frameEnded = 1;
        return 0;
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
        if ((input->pos < input->size) && (endOp == ZSTD_e_end))
            endOp = ZSTD_e_flush;   /* can't end now : not all input consumed */
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) );
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}